

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

int safe_pcre2_match_16(pcre2_code_16 *code,PCRE2_SPTR16 subject,qsizetype length,
                       qsizetype startOffset,int options,pcre2_match_data_16 *matchData,
                       pcre2_match_context_16 *matchContext)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long *in_FS_OFFSET;
  
  iVar3 = pcre2_match_16();
  if (iVar3 == -0x2e) {
    lVar1 = *in_FS_OFFSET;
    if (*(char *)(lVar1 + -8) == '\0') {
      safe_pcre2_match_16();
    }
    iVar3 = -0x2e;
    if (*(long *)(lVar1 + -0x10) == 0) {
      if (*(char *)(lVar1 + -8) == '\0') {
        safe_pcre2_match_16();
      }
      lVar4 = pcre2_jit_stack_create_16(0x8000,0x80000,0);
      lVar2 = *(long *)(lVar1 + -0x10);
      *(long *)(lVar1 + -0x10) = lVar4;
      if (lVar2 != 0) {
        pcre2_jit_stack_free_16();
      }
      iVar3 = pcre2_match_16(code,subject,length,startOffset,options,matchData);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int safe_pcre2_match_16(const pcre2_code_16 *code,
                               PCRE2_SPTR16 subject, qsizetype length,
                               qsizetype startOffset, int options,
                               pcre2_match_data_16 *matchData,
                               pcre2_match_context_16 *matchContext)
{
    int result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);

    if (result == PCRE2_ERROR_JIT_STACKLIMIT && !jitStacks) {
        // The default JIT stack size in PCRE is 32K,
        // we allocate from 32K up to 512K.
        jitStacks.reset(pcre2_jit_stack_create_16(32 * 1024, 512 * 1024, NULL));

        result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);
    }

    return result;
}